

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFabFactory.cpp
# Opt level: O2

void __thiscall amrex::EBFArrayBoxFactory::destroy(EBFArrayBoxFactory *this,FArrayBox *fab)

{
  if (fab != (FArrayBox *)0x0) {
    (*(fab->super_BaseFab<double>)._vptr_BaseFab[1])(fab);
    return;
  }
  return;
}

Assistant:

void
EBFArrayBoxFactory::destroy (FArrayBox* fab) const
{
    if (m_support == EBSupport::none)
    {
        delete fab;
    }
    else
    {
        EBFArrayBox* p = static_cast<EBFArrayBox*>(fab);
        delete p;
    }
}